

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

int * __thiscall
google::protobuf::RepeatedField<int>::elements(RepeatedField<int> *this,bool is_soo)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int *extraout_RAX;
  string *psVar7;
  string *extraout_RAX_00;
  char *pcVar8;
  ulong in_RCX;
  int extraout_EDX;
  ulong extraout_RDX;
  undefined1 uVar9;
  undefined7 in_register_00000031;
  RepeatedField<int> *pRVar10;
  ulong *puVar11;
  LongSooRep *this_00;
  undefined1 *puVar12;
  int *piVar13;
  undefined1 auStack_a0 [8];
  code *pcStack_98;
  LongSooRep LStack_88;
  ulong auStack_70 [2];
  RepeatedField<int> *pRStack_60;
  RepeatedField<int> RStack_38;
  RepeatedField<int> local_20;
  
  iVar4 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar4 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar4 < 1) {
    RStack_38.soo_rep_.field_0.short_rep.field_1 =
         (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x1a7db0;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar4,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    if (is_soo) {
      return (int *)((long)&(this->soo_rep_).field_0 + 8);
    }
    piVar6 = (int *)internal::LongSooRep::elements((LongSooRep *)this);
    return piVar6;
  }
  pRVar10 = &local_20;
  RStack_38.soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x1a7dbf
  ;
  elements();
  uVar9 = SUB81(psVar7,0);
  if ((undefined1  [16])((undefined1  [16])(pRVar10->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    InternalDeallocate<false>(pRVar10);
    return extraout_RAX;
  }
  pRVar10 = &RStack_38;
  InternalDeallocate<false>(pRVar10);
  uVar2 = (pRVar10->soo_rep_).field_0.long_rep.elements_int;
  pRStack_60 = this;
  if (((uVar2 & 4) == 0) == (bool)uVar9) {
    psVar7 = (string *)0x0;
  }
  else {
    LStack_88.size = 0x1a7e60;
    LStack_88.capacity = 0;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       ((bool)uVar9,(uVar2 & 4) == 0,"was_soo == is_soo()");
  }
  if (psVar7 == (string *)0x0) {
    if (in_RCX == 0) {
      LStack_88.size = 0x1a7e72;
      LStack_88.capacity = 0;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                         ((void *)0x0,(void *)0x0,"elements != nullptr");
    }
    else {
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      if ((in_RCX & 7) == 0) {
        psVar7 = (string *)0x0;
      }
      else {
        LStack_88.size = 0x1a7e82;
        LStack_88.capacity = 0;
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                           (in_RCX & 7,0,
                            "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                           );
      }
      if (psVar7 == (string *)0x0) {
        piVar6 = (int *)0x0;
        if ((bool)uVar9 != false) {
          uVar5 = *(uint *)&(pRVar10->soo_rep_).field_0 & 3;
          piVar6 = (int *)(ulong)uVar5;
          (pRVar10->soo_rep_).field_0.long_rep.size = uVar5;
        }
        (pRVar10->soo_rep_).field_0.long_rep.capacity = extraout_EDX;
        (pRVar10->soo_rep_).field_0.long_rep.elements_int = in_RCX | 4;
        return piVar6;
      }
      goto LAB_001a7e9e;
    }
  }
  else {
    LStack_88.size = 0x1a7e91;
    LStack_88.capacity = 0;
    internal::SooRep::set_non_soo();
  }
  LStack_88.size = 0x1a7e9e;
  LStack_88.capacity = 0;
  internal::SooRep::set_non_soo();
  psVar7 = extraout_RAX_00;
LAB_001a7e9e:
  puVar11 = auStack_70;
  LStack_88.size = 0x1a7eab;
  LStack_88.capacity = 0;
  internal::SooRep::set_non_soo();
  if ((*puVar11 & 4) == 0) {
    return (int *)(*puVar11 & 0xfffffffffffffff8);
  }
  this_00 = &LStack_88;
  pcStack_98 = heap_rep;
  internal::SooRep::soo_arena();
  if ((this_00->elements_int & 4) != 0) {
    pcVar8 = internal::LongSooRep::elements(this_00);
    return (int *)(pcVar8 + -8);
  }
  puVar12 = auStack_a0;
  heap_rep();
  if (0xf < extraout_RDX) {
    uVar2 = 0x3f;
    if (extraout_RDX != 0) {
      for (; extraout_RDX >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    piVar6 = (int *)((uVar2 ^ 0xffffffffffffffc0) + 0x3c);
    bVar1 = puVar12[0x68];
    if (piVar6 < (int *)(ulong)bVar1) {
      lVar3 = *(long *)(puVar12 + 0x70);
      *(undefined8 *)psVar7 = *(undefined8 *)(lVar3 + (long)piVar6 * 8);
      *(string **)(lVar3 + (long)piVar6 * 8) = psVar7;
    }
    else {
      piVar13 = (int *)(extraout_RDX >> 3);
      if ((int *)(ulong)bVar1 != (int *)0x0) {
        memmove(psVar7,*(void **)(puVar12 + 0x70),(ulong)bVar1 << 3);
      }
      bVar1 = puVar12[0x68];
      if (piVar13 != (int *)(ulong)bVar1) {
        memset(psVar7 + (ulong)bVar1 * 8,0,extraout_RDX + (ulong)bVar1 * -8 & 0xfffffffffffffff8);
      }
      *(string **)(puVar12 + 0x70) = psVar7;
      piVar6 = (int *)0x40;
      if (piVar13 < (int *)0x40) {
        piVar6 = piVar13;
      }
      puVar12[0x68] = (char)piVar6;
    }
    return piVar6;
  }
  google::protobuf::internal::protobuf_assumption_failed
            ("size >= 16",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,0x9e);
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }